

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O2

c_int osqp_update_polish_refine_iter(OSQPWorkspace *work,c_int polish_refine_iter_new)

{
  c_int cVar1;
  
  if (work == (OSQPWorkspace *)0x0) {
    cVar1 = _osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR,"osqp_update_polish_refine_iter");
    return cVar1;
  }
  if (-1 < polish_refine_iter_new) {
    work->settings->polish_refine_iter = polish_refine_iter_new;
    return 0;
  }
  printf("ERROR in %s: ","osqp_update_polish_refine_iter");
  printf("polish_refine_iter must be nonnegative");
  putchar(10);
  return 1;
}

Assistant:

c_int osqp_update_polish_refine_iter(OSQPWorkspace *work, c_int polish_refine_iter_new) {

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

  // Check that polish_refine_iter is nonnegative
  if (polish_refine_iter_new < 0) {
# ifdef PRINTING
    c_eprint("polish_refine_iter must be nonnegative");
# endif /* ifdef PRINTING */
    return 1;
  }

  // Update polish_refine_iter
  work->settings->polish_refine_iter = polish_refine_iter_new;

  return 0;
}